

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

bool __thiscall cfd::core::Psbt::IsFinalizedInput(Psbt *this,uint32_t index)

{
  void *pvVar1;
  CfdException *pCVar2;
  int ret;
  allocator local_41;
  undefined1 local_40 [32];
  size_t data;
  
  pvVar1 = this->wally_psbt_pointer_;
  data = 0;
  if (pvVar1 == (void *)0x0) {
    local_40._0_8_ = "cfdcore_psbt.cpp";
    local_40._8_4_ = 0x80d;
    local_40._16_8_ = "IsFinalizedInput";
    logger::warn<>((CfdSourceLocation *)local_40,"psbt pointer is null");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_40,"psbt pointer is null.",(allocator *)&ret);
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_40);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if ((*(long *)((long)pvVar1 + 0x10) != 0) && ((ulong)index < *(ulong *)((long)pvVar1 + 0x18))) {
    ret = wally_psbt_input_is_finalized
                    ((wally_psbt_input *)(*(long *)((long)pvVar1 + 0x10) + (ulong)index * 0x110),
                     &data);
    if (ret == 0) {
      return data == 1;
    }
    local_40._0_8_ = "cfdcore_psbt.cpp";
    local_40._8_4_ = 0x819;
    local_40._16_8_ = "IsFinalizedInput";
    logger::warn<int&>((CfdSourceLocation *)local_40,"wally_psbt_is_finalized NG[{}]",&ret);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_40,"psbt input check finalized error.",&local_41)
    ;
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_40);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_40._0_8_ = "cfdcore_psbt.cpp";
  local_40._8_4_ = 0x813;
  local_40._16_8_ = "IsFinalizedInput";
  logger::warn<>((CfdSourceLocation *)local_40,"psbt input out-of-range.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_40,"psbt input out-of-range.",(allocator *)&ret);
  CfdException::CfdException(pCVar2,kCfdOutOfRangeError,(string *)local_40);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool Psbt::IsFinalizedInput(uint32_t index) const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  size_t data = 0;
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  }

  if ((psbt_pointer->inputs == nullptr) ||
      (psbt_pointer->num_inputs <= index)) {
    warn(CFD_LOG_SOURCE, "psbt input out-of-range.");
    throw CfdException(kCfdOutOfRangeError, "psbt input out-of-range.");
  }

  int ret = wally_psbt_input_is_finalized(&psbt_pointer->inputs[index], &data);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_is_finalized NG[{}]", ret);
    throw CfdException(
        kCfdIllegalStateError, "psbt input check finalized error.");
  }
  return (data == 1);
}